

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall XipFile::~XipFile(XipFile *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  uint32_t size;
  _Base_ptr p_Var3;
  undefined8 *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ReadWriter_ptr wrhdrptr;
  uint32_t local_44;
  ByteVector hdr;
  
  (this->super_FileContainer)._vptr_FileContainer = (_func_int **)&PTR__XipFile_00142b10;
  if (this->_filelistmodified == true) {
    p_Var1 = &(this->_files)._M_t._M_impl.super__Rb_tree_header;
    uVar7 = 0;
    uVar5 = 0;
    for (p_Var3 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x40))();
      uVar7 = uVar7 + (cVar2 == 'F');
      uVar5 = uVar5 + (cVar2 != 'F');
    }
    (this->_hdr).nummods = uVar5;
    (this->_hdr).numfiles = uVar7;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&hdr,(ulong)uVar7 * 0x1c + (ulong)uVar5 * 0x20 + 0x54,(allocator_type *)&wrhdrptr);
    XipHeader::getdata(&this->_hdr,
                       (uint8_t *)
                       CONCAT44(hdr.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (int)hdr.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
    lVar6 = CONCAT44(hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_,
                     (int)hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start) + 0x54;
    for (p_Var3 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x40))();
      if (cVar2 == 'M') {
        (**(code **)(**(long **)(p_Var3 + 2) + 0x10))(*(long **)(p_Var3 + 2),lVar6);
        lVar6 = lVar6 + 0x20;
      }
    }
    for (p_Var3 = (this->_files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      cVar2 = (**(code **)(**(long **)(p_Var3 + 2) + 0x40))();
      if (cVar2 == 'F') {
        (**(code **)(**(long **)(p_Var3 + 2) + 0x10))(*(long **)(p_Var3 + 2),lVar6);
        lVar6 = lVar6 + 0x1c;
      }
    }
    size = allocmap::findfree(&this->_mm,
                              (int)hdr.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                              (int)hdr.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    (this->_hdr).hdrrva = size;
    if (size == 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "xip: could not alloc space for romhdr";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    getrvareader((XipFile *)&wrhdrptr,(uint32_t)this,size);
    (*(wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter
      [3])(wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
           CONCAT44(hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    (int)hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start),
           CONCAT44(hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish._4_4_,
                    (int)hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish) -
           CONCAT44(hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_,
                    (int)hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    getrvareader((XipFile *)&wrhdrptr,(uint32_t)this,(this->_hdr).rvabase + 0x44);
    local_44 = (this->_hdr).hdrrva;
    (*(wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter
      [3])(wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_44,4);
    local_44 = (this->_hdr).hdrrva - (this->_hdr).rvabase;
    (*(wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_ReadWriter
      [3])(wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_44,4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&wrhdrptr.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&hdr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
  ::~_Rb_tree(&(this->_files)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               *)&this->_mm);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_r).super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

~XipFile()
    {
        if (!_filelistmodified)
            return;

        size_t numfiles= 0;
        size_t nummods= 0;
        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
        {
            if (i->second->typechar()=='F')
                numfiles++;
            else
                nummods++;
        }
        _hdr.nummods= nummods;
        _hdr.numfiles= numfiles;

        ByteVector hdr(XipHeader::size()+_hdr.nummods*TocEntry::size()+_hdr.numfiles*FileEntry::size());

        _hdr.getdata(&hdr[0]);
        uint8_t *p= &hdr[XipHeader::size()];
        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
            if (i->second->typechar()=='M') {
                i->second->getentry(p);
                p += TocEntry::size();
            }

        for (auto i= _files.begin() ; i!=_files.end() ; ++i)
            if (i->second->typechar()=='F') {
                i->second->getentry(p);
                p += FileEntry::size();
            }

        uint32_t oldhdrrva= _hdr.hdrrva;

        _hdr.hdrrva= _mm.findfree(hdr.size());
        if (_hdr.hdrrva==0)
            throw "xip: could not alloc space for romhdr";
        getrvareader(_hdr.hdrrva, hdr.size())->write(&hdr[0], hdr.size());

        ReadWriter_ptr wrhdrptr= getrvareader(_hdr.rvabase+0x44, 8);
        wrhdrptr->write32le(_hdr.hdrrva);
        wrhdrptr->write32le(_hdr.hdrrva-_hdr.rvabase);

        update_romhdrptr_in_nk(oldhdrrva, _hdr.hdrrva);
    }